

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_table.c
# Opt level: O0

int aom_film_grain_table_lookup
              (aom_film_grain_table_t *t,int64_t time_stamp,int64_t end_time,int erase,
              aom_film_grain_t *grain)

{
  undefined2 uVar1;
  long lVar2;
  int aiVar3 [2];
  int in_ECX;
  long in_RDX;
  int in_RSI [2];
  int (*in_RDI) [2];
  void *in_R8;
  aom_film_grain_table_entry_t *new_entry;
  int64_t entry_end_time;
  aom_film_grain_table_entry_t *next;
  uint16_t random_seed;
  aom_film_grain_table_entry_t *prev_entry;
  aom_film_grain_table_entry_t *entry;
  void *in_stack_ffffffffffffffa0;
  int local_40 [2];
  int aiVar4 [2];
  int grain_00 [2];
  int erase_00;
  undefined4 in_stack_ffffffffffffffd8;
  
  aiVar4 = *in_RDI;
  local_40[0] = 0;
  local_40[1] = 0;
  aiVar3 = local_40;
  if (in_R8 == (void *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(undefined2 *)((long)in_R8 + 0x284);
    memset(in_R8,0,0x288);
  }
  do {
    grain_00 = aiVar4;
    local_40 = aiVar3;
    if (grain_00 == (int  [2])0x0) {
      return 0;
    }
    aiVar3 = grain_00;
    aiVar4 = *(int (*) [2])((long)grain_00 + 0x298);
  } while (((long)in_RSI < *(long *)((long)grain_00 + 0x288)) ||
          (*(long *)((long)grain_00 + 0x290) <= (long)in_RSI));
  if ((in_R8 != (void *)0x0) && (memcpy(in_R8,(void *)grain_00,0x288), in_RSI != (int  [2])0x0)) {
    *(undefined2 *)((long)in_R8 + 0x284) = uVar1;
  }
  erase_00 = (int)((ulong)in_R8 >> 0x20);
  if (in_ECX != 0) {
    aiVar4 = *(int (*) [2])((long)grain_00 + 0x290);
    lVar2._0_4_ = ((aom_film_grain_t *)((long)grain_00 + 0x288))->apply_grain;
    lVar2._4_4_ = ((aom_film_grain_t *)((long)grain_00 + 0x288))->update_parameters;
    if ((lVar2 < (long)in_RSI) || (in_RDX < (long)*(int (*) [2])((long)grain_00 + 0x290))) {
      if ((*(long *)((long)grain_00 + 0x288) < (long)in_RSI) ||
         (*(long *)((long)grain_00 + 0x290) <= in_RDX)) {
        if ((*(long *)((long)grain_00 + 0x288) < (long)in_RSI) &&
           (*(long *)((long)grain_00 + 0x290) <= in_RDX)) {
          *(int (*) [2])((long)grain_00 + 0x290) = in_RSI;
        }
        else {
          aiVar3 = (int  [2])aom_malloc(0x3a1daa);
          if (aiVar3 == (int  [2])0x0) {
            return 0;
          }
          *(int (*) [2])((long)aiVar3 + 0x298) = *(int (*) [2])((long)grain_00 + 0x298);
          *(long *)((long)aiVar3 + 0x288) = in_RDX;
          *(int (*) [2])((long)aiVar3 + 0x290) = *(int (*) [2])((long)grain_00 + 0x290);
          memcpy((void *)aiVar3,(void *)grain_00,0x288);
          *(int (*) [2])((long)grain_00 + 0x298) = aiVar3;
          *(int (*) [2])((long)grain_00 + 0x290) = in_RSI;
          if (in_RDI[1] == grain_00) {
            in_RDI[1] = aiVar3;
          }
        }
      }
      else {
        *(long *)((long)grain_00 + 0x288) = in_RDX;
      }
    }
    else {
      if (in_RDI[1] == grain_00) {
        in_RDI[1] = local_40;
      }
      if (local_40 == (int  [2])0x0) {
        *in_RDI = *(int (*) [2])((long)grain_00 + 0x298);
      }
      else {
        *(int (*) [2])((long)local_40 + 0x298) = *(int (*) [2])((long)grain_00 + 0x298);
      }
      aom_free(in_stack_ffffffffffffffa0);
    }
    if ((long)aiVar4 < in_RDX) {
      aom_film_grain_table_lookup
                ((aom_film_grain_table_t *)in_RSI,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                 erase_00,(aom_film_grain_t *)grain_00);
    }
  }
  return 1;
}

Assistant:

int aom_film_grain_table_lookup(aom_film_grain_table_t *t, int64_t time_stamp,
                                int64_t end_time, int erase,
                                aom_film_grain_t *grain) {
  aom_film_grain_table_entry_t *entry = t->head;
  aom_film_grain_table_entry_t *prev_entry = NULL;
  uint16_t random_seed = grain ? grain->random_seed : 0;
  if (grain) memset(grain, 0, sizeof(*grain));

  while (entry) {
    aom_film_grain_table_entry_t *next = entry->next;
    if (time_stamp >= entry->start_time && time_stamp < entry->end_time) {
      if (grain) {
        *grain = entry->params;
        if (time_stamp != 0) grain->random_seed = random_seed;
      }
      if (!erase) return 1;

      const int64_t entry_end_time = entry->end_time;
      if (time_stamp <= entry->start_time && end_time >= entry->end_time) {
        if (t->tail == entry) t->tail = prev_entry;
        if (prev_entry) {
          prev_entry->next = entry->next;
        } else {
          t->head = entry->next;
        }
        aom_free(entry);
      } else if (time_stamp <= entry->start_time &&
                 end_time < entry->end_time) {
        entry->start_time = end_time;
      } else if (time_stamp > entry->start_time &&
                 end_time >= entry->end_time) {
        entry->end_time = time_stamp;
      } else {
        aom_film_grain_table_entry_t *new_entry =
            aom_malloc(sizeof(*new_entry));
        if (!new_entry) return 0;
        new_entry->next = entry->next;
        new_entry->start_time = end_time;
        new_entry->end_time = entry->end_time;
        new_entry->params = entry->params;
        entry->next = new_entry;
        entry->end_time = time_stamp;
        if (t->tail == entry) t->tail = new_entry;
      }
      // If segments aren't aligned, delete from the beginning of subsequent
      // segments
      if (end_time > entry_end_time) {
        // Ignoring the return value here is safe since we're erasing from the
        // beginning of subsequent entries.
        aom_film_grain_table_lookup(t, entry_end_time, end_time, /*erase=*/1,
                                    NULL);
      }
      return 1;
    }
    prev_entry = entry;
    entry = next;
  }
  return 0;
}